

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleARGBRowDownEvenBox_C
               (uint8_t *src_argb,ptrdiff_t src_stride,int src_stepx,uint8_t *dst_argb,int dst_width
               )

{
  byte *pbVar1;
  long lVar2;
  
  if (0 < dst_width) {
    pbVar1 = src_argb + 7;
    lVar2 = 0;
    do {
      dst_argb[lVar2 * 4] =
           (uint8_t)((uint)pbVar1[src_stride + -7] + (uint)pbVar1[-3] + (uint)pbVar1[-7] +
                     (uint)pbVar1[src_stride + -3] + 2 >> 2);
      dst_argb[lVar2 * 4 + 1] =
           (uint8_t)((uint)pbVar1[src_stride + -6] + (uint)pbVar1[-2] + (uint)pbVar1[-6] +
                     (uint)pbVar1[src_stride + -2] + 2 >> 2);
      dst_argb[lVar2 * 4 + 2] =
           (uint8_t)((uint)pbVar1[src_stride + -5] + (uint)pbVar1[-1] + (uint)pbVar1[-5] +
                     (uint)pbVar1[src_stride + -1] + 2 >> 2);
      dst_argb[lVar2 * 4 + 3] =
           (uint8_t)((uint)pbVar1[src_stride + -4] + (uint)*pbVar1 + (uint)pbVar1[-4] +
                     (uint)pbVar1[src_stride] + 2 >> 2);
      lVar2 = lVar2 + 1;
      pbVar1 = pbVar1 + (src_stepx << 2);
    } while (dst_width != (int)lVar2);
  }
  return;
}

Assistant:

void ScaleARGBRowDownEvenBox_C(const uint8_t* src_argb,
                               ptrdiff_t src_stride,
                               int src_stepx,
                               uint8_t* dst_argb,
                               int dst_width) {
  int x;
  for (x = 0; x < dst_width; ++x) {
    dst_argb[0] = (src_argb[0] + src_argb[4] + src_argb[src_stride] +
                   src_argb[src_stride + 4] + 2) >>
                  2;
    dst_argb[1] = (src_argb[1] + src_argb[5] + src_argb[src_stride + 1] +
                   src_argb[src_stride + 5] + 2) >>
                  2;
    dst_argb[2] = (src_argb[2] + src_argb[6] + src_argb[src_stride + 2] +
                   src_argb[src_stride + 6] + 2) >>
                  2;
    dst_argb[3] = (src_argb[3] + src_argb[7] + src_argb[src_stride + 3] +
                   src_argb[src_stride + 7] + 2) >>
                  2;
    src_argb += src_stepx * 4;
    dst_argb += 4;
  }
}